

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O1

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
GenerateRuns(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
            vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *runs)

{
  pointer *pppRVar1;
  pointer ppRVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  iterator __position;
  iterator iVar6;
  bool bVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  RunBlock<int> **ppRVar13;
  int *piVar14;
  RunPool<int> *pRVar15;
  RunBlock<int> *pRVar16;
  RunBlock<int> *pRVar17;
  int *piVar18;
  ulong uVar19;
  int iVar20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  vector<int,std::allocator<int>> *pvVar28;
  ValueType value;
  RunPool<int> *run;
  int local_54;
  RunPool<int> *local_50;
  vector<int,std::allocator<int>> *local_48;
  double dStack_40;
  
  ppRVar2 = (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppRVar2) {
    (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppRVar2;
  }
  uVar23 = (long)end._M_current - (long)begin._M_current >> 2;
  dVar25 = (double)(long)uVar23;
  this->num_elements_ = uVar23;
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  uVar19 = (long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25;
  this->num_runs_ = uVar19;
  iVar20 = 0;
  _Var21._M_current = begin._M_current;
  if (end._M_current + -1 != begin._M_current) {
    do {
      piVar4 = _Var21._M_current + 1;
      iVar20 = iVar20 + (uint)(_Var21._M_current[1] < *_Var21._M_current);
      _Var21._M_current = piVar4;
    } while (piVar4 != end._M_current + -1);
  }
  this->values_not_in_order_ = iVar20;
  fVar24 = (float)iVar20 / (float)this->num_elements_;
  this->sortedness_ = fVar24;
  if (fVar24 <= 0.35) {
    fVar24 = (float)uVar19 * 1.5;
    uVar23 = (ulong)fVar24;
    run_blocks_ = (long)(fVar24 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23;
    Init();
    uVar23 = this->num_elements_;
    sVar3 = this->num_runs_;
    uVar19 = uVar23;
    uVar22 = uVar23;
    if (99 < uVar23) {
      do {
        uVar19 = uVar22 / 100;
        bVar7 = 9999 < uVar22;
        uVar22 = uVar19;
      } while (bVar7);
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar19;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar23;
    auVar27._8_4_ = (int)(sVar3 >> 0x20);
    auVar27._0_8_ = sVar3;
    auVar27._12_4_ = 0x45300000;
    dVar25 = auVar27._8_8_ - 1.9342813113834067e+25;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(auVar11 / auVar9,0);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar23;
    uVar23 = SUB168(auVar12 / auVar10,0);
    if ((long)uVar23 < 0) {
      fVar24 = (float)((ulong)(SUB164(auVar12 / auVar10,0) & 1) | uVar23 >> 1);
      fVar24 = fVar24 + fVar24;
    }
    else {
      fVar24 = (float)(long)uVar23;
    }
    pvVar28 = (vector<int,std::allocator<int>> *)
              (dVar25 + ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
    dVar26 = (double)(fVar24 * 15.0);
    if (dVar26 < 0.0) {
      local_48 = pvVar28;
      dStack_40 = dVar25;
      dVar26 = sqrt(dVar26);
      pvVar28 = local_48;
    }
    else {
      dVar26 = SQRT(dVar26);
    }
    uVar23 = (ulong)(dVar26 * (double)pvVar28);
    RunPool<int>::mem_blocks_ =
         (long)(dVar26 * (double)pvVar28 - 9.223372036854776e+18) & (long)uVar23 >> 0x3f | uVar23;
    RunPool<int>::Init();
    std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::reserve(runs,this->num_runs_);
    std::vector<int,_std::allocator<int>_>::reserve(&this->lasts_,this->num_elements_);
    local_48 = (vector<int,std::allocator<int>> *)&this->heads_;
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_48,this->num_elements_);
    for (; pRVar16 = RunPool<int>::next_free_, pRVar15 = next_free_,
        begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
      local_54 = *begin._M_current;
      piVar4 = (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar18 = piVar4;
      uVar23 = (long)piVar5 - (long)piVar4 >> 2;
      while (piVar14 = piVar18, 0 < (long)uVar23) {
        uVar19 = uVar23 >> 1;
        uVar23 = ~uVar19 + uVar23;
        piVar18 = piVar14 + uVar19 + 1;
        if (piVar14[uVar19] <= local_54) {
          piVar18 = piVar14;
          uVar23 = uVar19;
        }
      }
      if (piVar14 == piVar5) {
        piVar4 = (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar18 = piVar4;
        uVar23 = (long)piVar5 - (long)piVar4 >> 2;
        while (piVar14 = piVar18, 0 < (long)uVar23) {
          uVar19 = uVar23 >> 1;
          uVar23 = ~uVar19 + uVar23;
          piVar18 = piVar14 + uVar19 + 1;
          if (local_54 <= piVar14[uVar19]) {
            piVar18 = piVar14;
            uVar23 = uVar19;
          }
        }
        if (piVar14 == piVar5) {
          local_50 = next_free_;
          ppRVar13 = &next_free_->begin_back_;
          next_free_ = next_free_ + 1;
          pRVar17 = RunPool<int>::next_free_ + 1;
          *ppRVar13 = RunPool<int>::next_free_;
          RunPool<int>::next_free_ = pRVar17;
          pRVar15->end_back_ = pRVar16;
          pRVar15->size_ = 0;
          pRVar15->begin_front_ = (RunBlock<int> *)0x0;
          pRVar15->end_front_ = (RunBlock<int> *)0x0;
          pRVar15->end_block_ = pRVar16;
          __position._M_current =
               (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<RunPool<int>*,std::allocator<RunPool<int>*>>::
            _M_realloc_insert<RunPool<int>*const&>
                      ((vector<RunPool<int>*,std::allocator<RunPool<int>*>> *)runs,__position,
                       &local_50);
          }
          else {
            *__position._M_current = pRVar15;
            pppRVar1 = &(runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppRVar1 = *pppRVar1 + 1;
          }
          RunPool<int>::Add((runs->
                            super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish[-1],&local_54);
          iVar6._M_current =
               (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)this,iVar6,&local_54);
          }
          else {
            *iVar6._M_current = local_54;
            (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          iVar6._M_current =
               (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_48,iVar6,&local_54);
          }
          else {
            *iVar6._M_current = local_54;
            (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
        }
        else {
          RunPool<int>::AddFront
                    (*(RunPool<int> **)
                      ((long)(runs->
                             super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                      ((long)piVar14 - (long)piVar4) * 2),&local_54);
          *(int *)(*(long *)local_48 + ((long)piVar14 - (long)piVar4)) = local_54;
        }
      }
      else {
        RunPool<int>::Add(*(RunPool<int> **)
                           ((long)(runs->
                                  super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                           ((long)piVar14 - (long)piVar4) * 2),&local_54);
        *(int *)((long)(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + ((long)piVar14 - (long)piVar4)) = local_54
        ;
        if ((long)piVar14 - (long)piVar4 == 0) {
          piVar4 = begin._M_current + 1;
          piVar5 = piVar4;
          while (piVar18 = piVar5, piVar4 != end._M_current) {
            if (*piVar4 <=
                *(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
              begin._M_current = piVar18 + -1;
              break;
            }
            RunPool<int>::Add(*(runs->
                               super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                               _M_impl.super__Vector_impl_data._M_start,piVar18);
            *(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = *piVar18;
            piVar5 = piVar18 + 1;
            begin._M_current = piVar18;
          }
        }
      }
    }
  }
  else if (begin._M_current != end._M_current) {
    lVar8 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (begin._M_current,end._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (begin._M_current,end._M_current);
    return;
  }
  return;
}

Assistant:

void GenerateRuns(RAI begin, RAI end, std::vector<RunPool<ValueType>*>& runs) {
        runs.clear();
        num_elements_ = std::distance(begin, end);
        num_runs_ = static_cast<size_t>(sqrt(num_elements_));

        // calculate the degree of disorder
        values_not_in_order_ = GetOrderLevel(begin, end);
        sortedness_ = values_not_in_order_ / static_cast<float>(num_elements_);

        // fallback to std::sort if input data is too random
        if(sortedness_ > kMaxSortedness) {
            std::sort(begin, end);
            return;
        }

        // Pool for runs
        SetMemSize(num_runs_ * kRunPoolSize);
        Init();

        // Pool for runblocks
        RunPool<ValueType>::SetMemSize(GetMemPoolSize(num_elements_, num_runs_));
        RunPool<ValueType>::Init();


        runs.reserve(num_runs_);
        lasts_.reserve(num_elements_);
        heads_.reserve(num_elements_);

        for (auto it = begin; it != end; ++it) {

            // binary search the right run to insert the current element
            ValueType value = *it;
            auto key = std::lower_bound(lasts_.begin(), lasts_.end(), value, [](ValueType& v1, ValueType v2) { return v1 > v2;});

            if (key != lasts_.end()) {      // if suitable run is found, append
                size_t i = std::distance(lasts_.begin(), key);
                runs[i]->Add(value);
                lasts_[i] = value;

                // if we add to the first run, try to add as many elements as possible to avoid expensive binary search
                if (i == 0) {
                    auto next_value = std::next(it, 1);
                    while (next_value != end
                           && *next_value > lasts_[i]) {
                        it++;
                        runs[0]->Add(*it);
                        lasts_[0] = *it;
                    }
                }
            }
            else {      // no suitable run found, so we try to add the element to the begin of a run

                // binary search the beginnings to find a suitable run
                key = std::lower_bound(heads_.begin(), heads_.end(), value);
                if (key == heads_.end()) {      // no suitable run found, create a new run and add it to sorted runs vector

                    RunPool<ValueType>* run = Alloc();
                    new(run) RunPool<ValueType>();      // necessary, otherwise the objects are not initialized -> memory error
                    runs.push_back(run);

                    runs.back()->Add(value);
                    lasts_.push_back(value);
                    heads_.push_back(value);
                } else {
                    // suitable run found, so append to its beginning.
                    size_t i = std::distance(heads_.begin(), key);
                    runs[i]->AddFront(value);
                    heads_[i] = value;
                }
            }
        }
    }